

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

void __thiscall
TCMallocTest_AggressiveDecommit_Test::TestBody(TCMallocTest_AggressiveDecommit_Test *this)

{
  size_t __ptr;
  size_t __ptr_00;
  char cVar1;
  TestingPortal *pTVar2;
  long *plVar3;
  char *pcVar4;
  undefined1 local_50 [8];
  Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:151:30)>
  cleanup;
  size_t starting_bytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  AssertHelper local_28;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  pTVar2 = tcmalloc::TestingPortal::Get();
  cVar1 = (**(code **)(*(long *)pTVar2 + 8))(pTVar2);
  if (cVar1 == '\0') {
    pTVar2 = tcmalloc::TestingPortal::Get();
    cVar1 = (*(code *)**(undefined8 **)pTVar2)(pTVar2);
    if (cVar1 != '\0') {
      puts("Testing aggressive de-commit");
      plVar3 = (long *)MallocExtension::instance();
      (**(code **)(*plVar3 + 0x90))(plVar3);
      anon_unknown.dwarf_1e1b5::NumericProperty::Override((NumericProperty *)local_50,0x1621c0);
      starting_bytes = (size_t)malloc(0x100000);
      (*noopt_helper)(&starting_bytes);
      __ptr = starting_bytes;
      starting_bytes = (size_t)malloc(0x100000);
      (*noopt_helper)(&starting_bytes);
      __ptr_00 = starting_bytes;
      cleanup.callback_.name = (char *)GetUnmappedBytes();
      plVar3 = (long *)MallocExtension::instance();
      (**(code **)(*plVar3 + 0x88))(plVar3,0x100000);
      local_20._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           GetUnmappedBytes();
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&starting_bytes,"starting_bytes","GetUnmappedBytes()",
                 (unsigned_long *)&cleanup.callback_.name,(unsigned_long *)&local_20);
      if ((char)starting_bytes == '\0') {
        testing::Message::Message((Message *)&local_20);
        if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_30->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x42b,pcVar4);
        testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
        testing::internal::AssertHelper::~AssertHelper(&local_28);
        if (local_20._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_20._M_head_impl + 8))();
        }
      }
      if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_30,local_30);
      }
      free((void *)__ptr);
      local_20._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (cleanup.callback_.name + 0x100000);
      local_28.data_ = (AssertHelperData *)GetUnmappedBytes();
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&starting_bytes,"starting_bytes + MB","GetUnmappedBytes()",
                 (unsigned_long *)&local_20,(unsigned_long *)&local_28);
      if ((char)starting_bytes == '\0') {
        testing::Message::Message((Message *)&local_20);
        if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_30->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x430,pcVar4);
        testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
        testing::internal::AssertHelper::~AssertHelper(&local_28);
        if (local_20._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_20._M_head_impl + 8))();
        }
      }
      if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_30,local_30);
      }
      free((void *)__ptr_00);
      local_20._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (cleanup.callback_.name + 0x200000);
      local_28.data_ = (AssertHelperData *)GetUnmappedBytes();
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&starting_bytes,"starting_bytes + 2*MB","GetUnmappedBytes()",
                 (unsigned_long *)&local_20,(unsigned_long *)&local_28);
      if ((char)starting_bytes == '\0') {
        testing::Message::Message((Message *)&local_20);
        if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_30->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x434,pcVar4);
        testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
        testing::internal::AssertHelper::~AssertHelper(&local_28);
        if (local_20._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_20._M_head_impl + 8))();
        }
      }
      if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_30,local_30);
      }
      plVar3 = (long *)MallocExtension::instance();
      (**(code **)(*plVar3 + 0x90))(plVar3);
      local_20._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (cleanup.callback_.name + 0x200000);
      local_28.data_ = (AssertHelperData *)GetUnmappedBytes();
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&starting_bytes,"starting_bytes + 2*MB","GetUnmappedBytes()",
                 (unsigned_long *)&local_20,(unsigned_long *)&local_28);
      if ((char)starting_bytes == '\0') {
        testing::Message::Message((Message *)&local_20);
        if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_30->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x438,pcVar4);
        testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
        testing::internal::AssertHelper::~AssertHelper(&local_28);
        if (local_20._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_20._M_head_impl + 8))();
        }
      }
      if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_30,local_30);
      }
      starting_bytes = (size_t)malloc(0x100000);
      (*noopt_helper)(&starting_bytes);
      free((void *)starting_bytes);
      local_20._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (cleanup.callback_.name + 0x200000);
      local_28.data_ = (AssertHelperData *)GetUnmappedBytes();
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&starting_bytes,"starting_bytes + 2*MB","GetUnmappedBytes()",
                 (unsigned_long *)&local_20,(unsigned_long *)&local_28);
      if ((char)starting_bytes == '\0') {
        testing::Message::Message((Message *)&local_20);
        if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_30->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x43d,pcVar4);
        testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
        testing::internal::AssertHelper::~AssertHelper(&local_28);
        if (local_20._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_20._M_head_impl + 8))();
        }
      }
      if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_30,local_30);
      }
      puts("Done testing aggressive de-commit");
      tcmalloc::
      Cleanup<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:151:30)>
      ::~Cleanup((Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:151:30)>
                  *)local_50);
    }
  }
  return;
}

Assistant:

TEST(TCMallocTest, AggressiveDecommit) {
  // Debug allocation mode adds overhead to each allocation which
  // messes up all the equality tests here.  I just disable the
  // teset in this mode.
  if(TestingPortal::Get()->IsDebuggingMalloc() || !TestingPortal::Get()->HaveSystemRelease()) {
    return;
  }

  printf("Testing aggressive de-commit\n");

  MallocExtension::instance()->ReleaseFreeMemory();

  tcmalloc::Cleanup cleanup = kAggressiveDecommit.Override(1);

  static const int MB = 1048576;
  void* a = noopt(malloc(MB));
  void* b = noopt(malloc(MB));

  size_t starting_bytes = GetUnmappedBytes();

  // ReleaseToSystem shouldn't do anything either.
  MallocExtension::instance()->ReleaseToSystem(MB);
  EXPECT_EQ(starting_bytes, GetUnmappedBytes());

  free(a);

  // The span to release should be 1MB.
  EXPECT_EQ(starting_bytes + MB, GetUnmappedBytes());

  free(b);

  EXPECT_EQ(starting_bytes + 2*MB, GetUnmappedBytes());

  // Nothing else to release.
  MallocExtension::instance()->ReleaseFreeMemory();
  EXPECT_EQ(starting_bytes + 2*MB, GetUnmappedBytes());

  a = noopt(malloc(MB));
  free(a);

  EXPECT_EQ(starting_bytes + 2*MB, GetUnmappedBytes());

  printf("Done testing aggressive de-commit\n");
}